

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_program.c
# Opt level: O2

int archive_write_add_filter_program(archive *_a,char *cmd)

{
  int iVar1;
  archive_write_filter *f;
  undefined8 *puVar2;
  char *pcVar3;
  archive_write_program_data *paVar4;
  size_t sVar5;
  archive_string *paVar6;
  archive_string *as;
  
  f = __archive_write_allocate_filter(_a);
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_program");
  if (iVar1 != -0x1e) {
    puVar2 = (undefined8 *)calloc(1,0x28);
    f->data = puVar2;
    if (puVar2 != (undefined8 *)0x0) {
      pcVar3 = strdup(cmd);
      puVar2[4] = pcVar3;
      if (pcVar3 != (char *)0x0) {
        paVar4 = __archive_write_program_allocate();
        *puVar2 = paVar4;
        if (paVar4 != (archive_write_program_data *)0x0) {
          as = (archive_string *)(puVar2 + 1);
          sVar5 = strlen(cmd);
          paVar6 = archive_string_ensure(as,sVar5 + 10);
          if (paVar6 != (archive_string *)0x0) {
            puVar2[2] = 0;
            archive_strncat(as,"Program: ",9);
            archive_strcat(as,cmd);
            f->name = (char *)puVar2[1];
            f->code = 4;
            f->open = archive_compressor_program_open;
            f->write = archive_compressor_program_write;
            f->close = archive_compressor_program_close;
            f->free = archive_compressor_program_free;
            return 0;
          }
        }
      }
    }
    archive_compressor_program_free(f);
    archive_set_error(_a,0xc,"Can\'t allocate memory for filter program");
  }
  return -0x1e;
}

Assistant:

int
archive_write_add_filter_program(struct archive *_a, const char *cmd)
{
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct private_data *data;
	static const char *prefix = "Program: ";

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_program");

	f->data = calloc(1, sizeof(*data));
	if (f->data == NULL)
		goto memerr;
	data = (struct private_data *)f->data;

	data->cmd = strdup(cmd);
	if (data->cmd == NULL)
		goto memerr;

	data->pdata = __archive_write_program_allocate();
	if (data->pdata == NULL)
		goto memerr;

	/* Make up a description string. */
	if (archive_string_ensure(&data->description,
	    strlen(prefix) + strlen(cmd) + 1) == NULL)
		goto memerr;
	archive_strcpy(&data->description, prefix);
	archive_strcat(&data->description, cmd);

	f->name = data->description.s;
	f->code = ARCHIVE_FILTER_PROGRAM;
	f->open = archive_compressor_program_open;
	f->write = archive_compressor_program_write;
	f->close = archive_compressor_program_close;
	f->free = archive_compressor_program_free;
	return (ARCHIVE_OK);
memerr:
	archive_compressor_program_free(f);
	archive_set_error(_a, ENOMEM,
	    "Can't allocate memory for filter program");
	return (ARCHIVE_FATAL);
}